

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::EnforceCommentStyle::fixComment
          (EnforceCommentStyle *this,string *s,bool preserve_hash)

{
  char *pcVar1;
  long *plVar2;
  long *plVar3;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  if (((this->super_FmtPass).opts.commentStyle == 'h') && (*(s->_M_dataplus)._M_p == '/')) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)s);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x21cb10);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_38 = *plVar3;
      lStack_30 = plVar2[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar3;
      local_48 = (long *)*plVar2;
    }
    local_40 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)s,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  if ((((this->super_FmtPass).opts.commentStyle == 's') &&
      (pcVar1 = (s->_M_dataplus)._M_p, *pcVar1 == '#')) && ((!preserve_hash || (pcVar1[1] != '!'))))
  {
    std::__cxx11::string::substr((ulong)local_68,(ulong)s);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x214425);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_38 = *plVar3;
      lStack_30 = plVar2[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar3;
      local_48 = (long *)*plVar2;
    }
    local_40 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)s,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  return;
}

Assistant:

void fixComment(std::string &s, bool preserve_hash)
    {
        if (opts.commentStyle == 'h' && s[0] == '/') {
            s = "#" + s.substr(2);
        }
        if (opts.commentStyle == 's' && s[0] == '#') {
            if (preserve_hash && s[1] == '!')
                return;
            s = "//" + s.substr(1);
        }
    }